

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O0

void __thiscall json_deserializer::json_reader::json_reader(json_reader *this,string *value)

{
  string local_38;
  string *local_18;
  string *value_local;
  json_reader *this_local;
  
  this->index = 0;
  local_18 = value;
  value_local = (string *)this;
  std::__cxx11::string::string((string *)&this->cbuf);
  trim(&local_38,local_18);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->cbuf,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

explicit json_reader(const string& value) {
            cbuf = trim(value);
        }